

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmXMLWriter *xml)

{
  cmMakefile *this_00;
  cmGeneratorTarget *this_01;
  TargetType TVar1;
  cmGlobalGenerator *pcVar2;
  char *pcVar3;
  string *psVar4;
  cmSourceGroup *this_02;
  pointer ppcVar5;
  pointer ppcVar6;
  pointer ppcVar7;
  string linkName2;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string linkName;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  allocator local_112;
  allocator local_111;
  cmExtraEclipseCDT4Generator *local_110;
  string local_108;
  _Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_e8;
  pointer local_d0;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *local_c8;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_c0;
  string local_a8;
  string local_88;
  string local_68;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> local_48;
  
  local_110 = this;
  std::__cxx11::string::string((string *)&local_88,"[Targets]",(allocator *)&local_108);
  std::__cxx11::string::string((string *)&local_108,"virtual:/virtual",(allocator *)&local_a8);
  AppendLinkedResource(xml,&local_88,&local_108,VirtualFolder);
  std::__cxx11::string::~string((string *)&local_108);
  pcVar2 = (local_110->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  ppcVar5 = (pcVar2->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (ppcVar5 !=
         (pcVar2->LocalGenerators).
         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    this_00 = (*ppcVar5)->Makefile;
    local_d0 = ppcVar5;
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_c0,
               &(*ppcVar5)->GeneratorTargets);
    local_c8 = &this_00->SourceGroups;
    for (ppcVar7 = local_c0._M_impl.super__Vector_impl_data._M_start;
        ppcVar7 != local_c0._M_impl.super__Vector_impl_data._M_finish; ppcVar7 = ppcVar7 + 1) {
      std::__cxx11::string::string((string *)&local_108,(string *)&local_88);
      std::__cxx11::string::append((char *)&local_108);
      TVar1 = cmGeneratorTarget::GetType(*ppcVar7);
      if (TVar1 < UTILITY) {
        cmGeneratorTarget::GetType(*ppcVar7);
        std::__cxx11::string::append((char *)&local_108);
        cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar7);
        std::__cxx11::string::append((string *)&local_108);
        std::__cxx11::string::string((string *)&local_a8,"virtual:/virtual",(allocator *)&local_68);
        AppendLinkedResource(xml,&local_108,&local_a8,VirtualFolder);
        std::__cxx11::string::~string((string *)&local_a8);
        if (local_110->GenerateLinkedResources != false) {
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector(&local_48,local_c8);
          this_01 = *ppcVar7;
          local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string((string *)&local_68,"CMAKE_BUILD_TYPE",&local_111);
          pcVar3 = cmMakefile::GetSafeDefinition(this_00,&local_68);
          std::__cxx11::string::string((string *)&local_a8,pcVar3,&local_112);
          cmGeneratorTarget::GetSourceFiles
                    (this_01,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_e8,
                     &local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_68);
          for (ppcVar6 = local_e8._M_impl.super__Vector_impl_data._M_start;
              ppcVar6 != local_e8._M_impl.super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1)
          {
            psVar4 = cmSourceFile::GetFullPath(*ppcVar6,(string *)0x0);
            this_02 = cmMakefile::FindSourceGroup(this_00,(psVar4->_M_dataplus)._M_p,&local_48);
            cmSourceGroup::AssignSource(this_02,*ppcVar6);
          }
          WriteGroups(local_110,&local_48,&local_108,xml);
          std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                    (&local_e8);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&local_48);
        }
      }
      std::__cxx11::string::~string((string *)&local_108);
    }
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              (&local_c0);
    pcVar2 = (local_110->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    ppcVar5 = local_d0 + 1;
  }
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(cmXMLWriter& xml)
{
  std::string linkName = "[Targets]";
  this->AppendLinkedResource(xml, linkName, "virtual:/virtual", VirtualFolder);

  for (std::vector<cmLocalGenerator*>::const_iterator lgIt =
         this->GlobalGenerator->GetLocalGenerators().begin();
       lgIt != this->GlobalGenerator->GetLocalGenerators().end(); ++lgIt) {
    cmMakefile* makefile = (*lgIt)->GetMakefile();
    const std::vector<cmGeneratorTarget*> targets =
      (*lgIt)->GetGeneratorTargets();

    for (std::vector<cmGeneratorTarget*>::const_iterator ti = targets.begin();
         ti != targets.end(); ++ti) {
      std::string linkName2 = linkName;
      linkName2 += "/";
      switch ((*ti)->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          const char* prefix =
            ((*ti)->GetType() == cmStateEnums::EXECUTABLE ? "[exe] "
                                                          : "[lib] ");
          linkName2 += prefix;
          linkName2 += (*ti)->GetName();
          this->AppendLinkedResource(xml, linkName2, "virtual:/virtual",
                                     VirtualFolder);
          if (!this->GenerateLinkedResources) {
            break; // skip generating the linked resources to the source files
          }
          std::vector<cmSourceGroup> sourceGroups =
            makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          cmGeneratorTarget* gt = const_cast<cmGeneratorTarget*>(*ti);
          std::vector<cmSourceFile*> files;
          gt->GetSourceFiles(files,
                             makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (std::vector<cmSourceFile*>::const_iterator sfIt = files.begin();
               sfIt != files.end(); sfIt++) {
            // Add the file to the list of sources.
            std::string const& source = (*sfIt)->GetFullPath();
            cmSourceGroup* sourceGroup =
              makefile->FindSourceGroup(source.c_str(), sourceGroups);
            sourceGroup->AssignSource(*sfIt);
          }

          this->WriteGroups(sourceGroups, linkName2, xml);
        } break;
        // ignore all others:
        default:
          break;
      }
    }
  }
}